

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

int LZ4_compressHC2_limitedOutput_withStateHC
              (void *state,char *src,char *dst,int srcSize,int maxDstSize,int cLevel)

{
  int iVar1;
  int in_ECX;
  char *in_RDX;
  char *in_RSI;
  void *in_RDI;
  int in_R8D;
  int in_R9D;
  
  iVar1 = LZ4_compress_HC_extStateHC(in_RDI,in_RSI,in_RDX,in_ECX,in_R8D,in_R9D);
  return iVar1;
}

Assistant:

int LZ4_compressHC2_limitedOutput_withStateHC (void* state, const char* src, char* dst, int srcSize, int maxDstSize, int cLevel) { return LZ4_compress_HC_extStateHC(state, src, dst, srcSize, maxDstSize, cLevel); }